

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootchart.c
# Opt level: O0

int proc_read(char *filename,char *buff,size_t buffsize)

{
  int iVar1;
  long in_RSI;
  char *in_RDI;
  int fd;
  int len;
  int in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  int fd_00;
  
  fd_00 = 0;
  iVar1 = open(in_RDI,0);
  if (-1 < iVar1) {
    fd_00 = unix_read(fd_00,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    close(iVar1);
  }
  iVar1 = fd_00;
  if (fd_00 < 1) {
    iVar1 = 0;
  }
  *(undefined1 *)(in_RSI + iVar1) = 0;
  return fd_00;
}

Assistant:

static int
proc_read(const char*  filename, char* buff, size_t  buffsize)
{
    int  len = 0;
    int  fd  = open(filename, O_RDONLY);
    if (fd >= 0) {
        len = unix_read(fd, buff, buffsize-1);
        close(fd);
    }
    buff[len > 0 ? len : 0] = 0;
    return len;
}